

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O3

ostream * Omega_h::operator<<(ostream *os,FiniteAutomaton *fa)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  ostream *poVar4;
  undefined8 uVar5;
  char *pcVar6;
  int iVar7;
  undefined8 uStack_38;
  
  pcVar6 = "nfa ";
  if (fa->is_deterministic != false) {
    pcVar6 = "dfa ";
  }
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,4);
  iVar2 = get_nrows<int>(&fa->table);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," states ",8);
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar4,(fa->table).ncols + (uint)fa->is_deterministic * 2 + -2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," symbols\n",9);
  iVar2 = get_nrows<int>(&fa->table);
  if (0 < iVar2) {
    iVar2 = 0;
    do {
      iVar3 = (fa->table).ncols;
      bVar1 = fa->is_deterministic;
      if (0 < (int)(iVar3 + -2 + (uint)bVar1 * 2)) {
        iVar7 = 0;
        do {
          iVar3 = step(fa,iVar2,iVar7);
          if (iVar3 != -1) {
            std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,iVar2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,") -> ",5);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar3);
            uStack_38._0_6_ = CONCAT15(10,(undefined5)uStack_38);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,(char *)((long)&uStack_38 + 5),1);
          }
          iVar7 = iVar7 + 1;
          iVar3 = (fa->table).ncols;
          bVar1 = fa->is_deterministic;
        } while (iVar7 < (int)(iVar3 + -2 + (uint)bVar1 * 2));
      }
      if (bVar1 == 0) {
        while (iVar3 + -2 < (fa->table).ncols) {
          iVar7 = step(fa,iVar2,iVar3 + -2);
          if (iVar7 != -1) {
            std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,iVar2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", eps",5);
            if (fa->is_deterministic == true) {
              uVar5 = 0x1f;
              goto LAB_002c34e7;
            }
            poVar4 = (ostream *)
                     std::ostream::operator<<((ostream *)poVar4,iVar3 - (fa->table).ncols);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,") -> ",5);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar7);
            uStack_38._0_7_ = CONCAT16(10,(undefined6)uStack_38);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,(char *)((long)&uStack_38 + 6),1);
          }
          iVar3 = iVar3 + 1;
          if (fa->is_deterministic != false) {
            uVar5 = 0x24;
LAB_002c34e7:
            fail("assertion %s failed at %s +%d\n","!fa.is_deterministic",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_finite_automaton.cpp"
                 ,uVar5);
          }
        }
      }
      iVar3 = accepts(fa,iVar2);
      if (iVar3 != -1) {
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,iVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," accepts ",9);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar3);
        uStack_38 = CONCAT17(10,(undefined7)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)((long)&uStack_38 + 7),1);
      }
      iVar2 = iVar2 + 1;
      iVar3 = get_nrows<int>(&fa->table);
    } while (iVar2 < iVar3);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, FiniteAutomaton const& fa) {
  if (get_determinism(fa))
    os << "dfa ";
  else
    os << "nfa ";
  os << get_nstates(fa) << " states " << get_nsymbols(fa) << " symbols\n";
  for (int state = 0; state < get_nstates(fa); ++state) {
    for (int symbol = 0; symbol < get_nsymbols(fa); ++symbol) {
      auto next_state = step(fa, state, symbol);
      if (next_state != -1)
        os << "(" << state << ", " << symbol << ") -> " << next_state << '\n';
    }
    if (!get_determinism(fa)) {
      for (int symbol = get_epsilon0(fa); symbol <= get_epsilon1(fa);
           ++symbol) {
        auto next_state = step(fa, state, symbol);
        if (next_state != -1)
          os << "(" << state << ", eps" << (symbol - get_epsilon0(fa))
             << ") -> " << next_state << '\n';
      }
    }
    auto token = accepts(fa, state);
    if (token != -1) os << state << " accepts " << token << '\n';
  }
  return os;
}